

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

bool __thiscall libcellml::Generator::GeneratorImpl::modelHasOdes(GeneratorImpl *this)

{
  Type TVar1;
  element_type *this_00;
  GeneratorImpl *this_local;
  
  this_00 = std::
            __shared_ptr_access<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  TVar1 = AnalyserModel::type(this_00);
  if ((TVar1 == DAE) || (TVar1 == ODE)) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Generator::GeneratorImpl::modelHasOdes() const
{
    switch (mModel->type()) {
    case AnalyserModel::Type::ODE:
    case AnalyserModel::Type::DAE:
        return true;
    default:
        return false;
    }
}